

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O0

bool __thiscall gimage::JPEGImageIO::handlesFile(JPEGImageIO *this,char *name,bool reading)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte in_DL;
  char *in_RSI;
  string s;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < 5) {
    local_1 = 0;
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char *)local_40,0x172ae9);
    lVar3 = std::__cxx11::string::size();
    if (lVar2 != lVar3 + -4) {
      lVar2 = std::__cxx11::string::rfind((char *)local_40,0x172aee);
      lVar3 = std::__cxx11::string::size();
      if (lVar2 != lVar3 + -4) {
        local_1 = 0;
        goto LAB_00169636;
      }
    }
    local_1 = 1;
  }
LAB_00169636:
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool JPEGImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".jpg") == s.size()-4 || s.rfind(".JPG") == s.size()-4)
  {
    return true;
  }

  return false;
}